

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O0

uint32 unigram_next(lm_trie_t *trie,int order)

{
  uint32 local_18;
  int order_local;
  lm_trie_t *trie_local;
  
  if (order == 2) {
    local_18 = (trie->longest->base).insert_index;
  }
  else {
    local_18 = (trie->middle_begin->base).insert_index;
  }
  return local_18;
}

Assistant:

static uint32
unigram_next(lm_trie_t * trie, int order)
{
    return order ==
        2 ? trie->longest->base.insert_index : trie->middle_begin->base.
        insert_index;
}